

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::SourceCodeInfo::SerializeWithCachedSizesToArray
          (SourceCodeInfo *this,uint8 *target)

{
  uint value;
  SourceCodeInfo_Location *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint8 *puVar2;
  long lVar3;
  
  if (0 < (this->location_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      this_00 = (SourceCodeInfo_Location *)
                (this->location_).super_RepeatedPtrFieldBase.elements_[lVar3];
      *target = '\n';
      value = this_00->_cached_size_;
      if (value < 0x80) {
        target[1] = (uint8)value;
        puVar2 = target + 2;
      }
      else {
        puVar2 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 1);
      }
      target = SourceCodeInfo_Location::SerializeWithCachedSizesToArray(this_00,puVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->location_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar2 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar2;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  for (int i = 0; i < this->location_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        1, this->location(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}